

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_validator_options.cpp
# Opt level: O0

spv_validator_options spvValidatorOptionsCreate(void)

{
  spv_validator_options_t *this;
  
  this = (spv_validator_options_t *)operator_new(0x30);
  spv_validator_options_t::spv_validator_options_t(this);
  return this;
}

Assistant:

spv_validator_options spvValidatorOptionsCreate(void) {
  return new spv_validator_options_t;
}